

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

Value * __thiscall
cmFileAPI::BuildInternalTest(Value *__return_storage_ptr__,cmFileAPI *this,Object *object)

{
  Value *pVVar1;
  Value *__return_storage_ptr___00;
  Value local_90;
  Value local_68;
  Value local_40;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_90,ObjectKindName::objectKindNames[(int)object->Kind]);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"kind");
  Json::Value::operator=(pVVar1,&local_90);
  Json::Value::~Value(&local_90);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"version");
  if (object->Version == 2) {
    __return_storage_ptr___00 = &local_40;
    BuildVersion(__return_storage_ptr___00,2,0);
    Json::Value::operator=(pVVar1,__return_storage_ptr___00);
  }
  else {
    __return_storage_ptr___00 = &local_68;
    BuildVersion(__return_storage_ptr___00,1,3);
    Json::Value::operator=(pVVar1,__return_storage_ptr___00);
  }
  Json::Value::~Value(__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildInternalTest(Object const& object)
{
  Json::Value test = Json::objectValue;
  test["kind"] = this->ObjectKindName(object.Kind);
  Json::Value& version = test["version"];
  if (object.Version == 2) {
    version = BuildVersion(2, InternalTestV2Minor);
  } else {
    version = BuildVersion(1, InternalTestV1Minor);
  }
  return test;
}